

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Protector.cpp
# Opt level: O0

void __thiscall
CppUnit::Protector::reportError(Protector *this,ProtectorContext *context,Exception *error)

{
  Test *pTVar1;
  TestResult *pTVar2;
  element_type *peVar3;
  element_type *this_00;
  Message local_118;
  Message local_a0;
  auto_ptr<CppUnit::Exception> local_28;
  auto_ptr<CppUnit::Exception> actualError;
  Exception *error_local;
  ProtectorContext *context_local;
  Protector *this_local;
  
  actualError._M_ptr = error;
  peVar3 = (element_type *)(**(code **)(*(long *)error + 0x18))();
  std::auto_ptr<CppUnit::Exception>::auto_ptr(&local_28,peVar3);
  peVar3 = std::auto_ptr<CppUnit::Exception>::operator->(&local_28);
  this_00 = std::auto_ptr<CppUnit::Exception>::operator->(&local_28);
  Exception::message(&local_118,this_00);
  actualMessage(&local_a0,this,&local_118,context);
  Exception::setMessage(peVar3,&local_a0);
  Message::~Message(&local_a0);
  Message::~Message(&local_118);
  pTVar1 = context->m_test;
  pTVar2 = context->m_result;
  peVar3 = std::auto_ptr<CppUnit::Exception>::release(&local_28);
  (*(pTVar2->super_SynchronizedObject)._vptr_SynchronizedObject[9])(pTVar2,pTVar1,peVar3);
  std::auto_ptr<CppUnit::Exception>::~auto_ptr(&local_28);
  return;
}

Assistant:

void 
Protector::reportError( const ProtectorContext &context,
                        const Exception &error ) const
{
  std::auto_ptr<Exception> actualError( error.clone() );
  actualError->setMessage( actualMessage( actualError->message(), context ) );
  context.m_result->addError( context.m_test, 
                              actualError.release() );
}